

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O2

bool ONX_Model::GetRDKEmbeddedFilePaths(ONX_Model_UserData *docud,ON_ClassArray<ON_wString> *paths)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ON_Read3dmBufferArchive archive;
  ON_wString OStack_268;
  ON_Read3dmBufferArchive local_260;
  
  bVar1 = ::IsRDKDocumentInformation(docud);
  if (bVar1) {
    ON_Read3dmBufferArchive::ON_Read3dmBufferArchive
              (&local_260,(long)(docud->m_goo).m_value,(docud->m_goo).m_goo,false,
               docud->m_usertable_3dm_version,docud->m_usertable_opennurbs_version);
    uVar2 = SeekArchiveToEmbeddedFiles(&local_260,(docud->m_goo).m_value);
    uVar3 = 0;
    if (uVar2 != 0) {
      if (0 < (int)uVar2) {
        uVar3 = uVar2;
      }
      while (bVar1 = uVar3 != 0, uVar3 = uVar3 - 1, bVar1) {
        ON_wString::ON_wString(&OStack_268);
        bVar1 = ON_BinaryArchive::ReadString(&local_260.super_ON_BinaryArchive,&OStack_268);
        if (!bVar1) {
          ON_wString::~ON_wString(&OStack_268);
          uVar3 = 0;
          goto LAB_0048b2bf;
        }
        ON_ClassArray<ON_wString>::Append(paths,&OStack_268);
        SeekArchivePastCompressedBuffer(&local_260.super_ON_BinaryArchive);
        ON_wString::~ON_wString(&OStack_268);
      }
      uVar3 = (uint)(0 < paths->m_count);
    }
LAB_0048b2bf:
    bVar1 = SUB41(uVar3,0);
    ON_Read3dmBufferArchive::~ON_Read3dmBufferArchive(&local_260);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ONX_Model::GetRDKEmbeddedFilePaths(const ONX_Model_UserData& docud, ON_ClassArray<ON_wString>& paths)
{
  if (!::IsRDKDocumentInformation(docud))
    return false;

  ON_Read3dmBufferArchive archive(docud.m_goo.m_value, docud.m_goo.m_goo, false, docud.m_usertable_3dm_version, docud.m_usertable_opennurbs_version);

  const int count = SeekArchiveToEmbeddedFiles(archive, docud.m_goo.m_value);
  if (!ReadEmbeddedFilePathsFromArchive(archive, count, paths))
    return false;

  return true;
}